

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O0

stbi_uc stbi__get_marker(stbi__jpeg *j)

{
  stbi_uc sVar1;
  stbi_uc local_19;
  stbi_uc x;
  stbi__jpeg *j_local;
  
  if (j->marker == 0xff) {
    sVar1 = stbi__get8(j->s);
    if (sVar1 == 0xff) {
      local_19 = 0xff;
      while (local_19 == 0xff) {
        local_19 = stbi__get8(j->s);
      }
      j_local._7_1_ = local_19;
    }
    else {
      j_local._7_1_ = 0xff;
    }
  }
  else {
    j_local._7_1_ = j->marker;
    j->marker = 0xff;
  }
  return j_local._7_1_;
}

Assistant:

static stbi_uc stbi__get_marker(stbi__jpeg *j)
{
   stbi_uc x;
   if (j->marker != STBI__MARKER_none) { x = j->marker; j->marker = STBI__MARKER_none; return x; }
   x = stbi__get8(j->s);
   if (x != 0xff) return STBI__MARKER_none;
   while (x == 0xff)
      x = stbi__get8(j->s); // consume repeated 0xff fill bytes
   return x;
}